

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_adapt.c
# Opt level: O0

REF_STATUS ref_adapt_tattle_faces(REF_GRID ref_grid)

{
  REF_MPI ref_mpi_00;
  REF_STATUS RVar1;
  uint uVar2;
  REF_DBL local_160;
  REF_DBL local_158;
  REF_DBL local_150;
  REF_DBL local_148;
  REF_DBL local_140;
  REF_STATUS ref_private_macro_code_rss_14;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT max_id;
  REF_INT min_id;
  REF_INT id;
  REF_INT n1;
  REF_INT n0;
  REF_INT edge;
  REF_DBL min_angle;
  REF_DBL angle;
  REF_DBL max_ratio;
  REF_DBL min_ratio;
  REF_DBL ratio;
  REF_DBL min_normdev;
  REF_DBL normdev;
  REF_DBL min_quality;
  REF_DBL quality;
  REF_INT nodes [27];
  REF_INT cell;
  REF_CELL ref_cell;
  REF_MPI ref_mpi;
  REF_GRID ref_grid_local;
  
  ref_mpi_00 = ref_grid->mpi;
  unique0x00012000 = ref_grid->cell[3];
  ref_grid_local._4_4_ =
       ref_cell_id_range(unique0x00012000,ref_mpi_00,&ref_private_macro_code_rss,
                         &ref_private_macro_code_rss_1);
  if (ref_grid_local._4_4_ == 0) {
    for (max_id = ref_private_macro_code_rss; max_id <= ref_private_macro_code_rss_1;
        max_id = max_id + 1) {
      normdev = 1.0;
      for (nodes[0x19] = 0; nodes[0x19] < stack0xffffffffffffffd8->max;
          nodes[0x19] = nodes[0x19] + 1) {
        RVar1 = ref_cell_nodes(stack0xffffffffffffffd8,nodes[0x19],(REF_INT *)&quality);
        if ((RVar1 == 0) && (max_id == nodes[(long)stack0xffffffffffffffd8->node_per + -2])) {
          uVar2 = ref_node_tri_quality(ref_grid->node,(REF_INT *)&quality,&min_quality);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                   ,0x21c,"ref_adapt_tattle_faces",(ulong)uVar2,"qual");
            return uVar2;
          }
          if (min_quality <= normdev) {
            local_140 = min_quality;
          }
          else {
            local_140 = normdev;
          }
          normdev = local_140;
        }
      }
      min_quality = normdev;
      uVar2 = ref_mpi_min(ref_mpi_00,&min_quality,&normdev,3);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",
               0x220,"ref_adapt_tattle_faces",(ulong)uVar2,"min");
        return uVar2;
      }
      uVar2 = ref_mpi_bcast(ref_mpi_00,&min_quality,1,3);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",
               0x221,"ref_adapt_tattle_faces",(ulong)uVar2,"min");
        return uVar2;
      }
      ratio = 2.0;
      _n0 = 90.0;
      if ((ref_grid->geom->model != (void *)0x0) || (ref_grid->geom->meshlink != (void *)0x0)) {
        unique0x00012000 = ref_grid->cell[3];
        for (nodes[0x19] = 0; nodes[0x19] < stack0xffffffffffffffd8->max;
            nodes[0x19] = nodes[0x19] + 1) {
          RVar1 = ref_cell_nodes(stack0xffffffffffffffd8,nodes[0x19],(REF_INT *)&quality);
          if ((RVar1 == 0) && (max_id == nodes[(long)stack0xffffffffffffffd8->node_per + -2])) {
            uVar2 = ref_geom_tri_norm_deviation(ref_grid,(REF_INT *)&quality,&min_normdev);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                     ,0x22a,"ref_adapt_tattle_faces",(ulong)uVar2,"norm dev");
              return uVar2;
            }
            if (min_normdev <= ratio) {
              local_148 = min_normdev;
            }
            else {
              local_148 = ratio;
            }
            ratio = local_148;
            uVar2 = ref_adapt_min_sliver_angle(ref_grid,(REF_INT *)&quality,(REF_DBL *)&n0);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                     ,0x22d,"ref_adapt_tattle_faces",(ulong)uVar2,"sliver angle");
              return uVar2;
            }
          }
        }
      }
      min_normdev = ratio;
      uVar2 = ref_mpi_min(ref_mpi_00,&min_normdev,&ratio,3);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",
               0x231,"ref_adapt_tattle_faces",(ulong)uVar2,"mpi max");
        return uVar2;
      }
      uVar2 = ref_mpi_bcast(ref_mpi_00,&ratio,1,3);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",
               0x232,"ref_adapt_tattle_faces",(ulong)uVar2,"min");
        return uVar2;
      }
      min_angle = _n0;
      uVar2 = ref_mpi_min(ref_mpi_00,&min_angle,&n0,3);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",
               0x234,"ref_adapt_tattle_faces",(ulong)uVar2,"mpi max");
        return uVar2;
      }
      uVar2 = ref_mpi_bcast(ref_mpi_00,&n0,1,3);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",
               0x235,"ref_adapt_tattle_faces",(ulong)uVar2,"min");
        return uVar2;
      }
      max_ratio = 1e+200;
      angle = -1e+200;
      for (nodes[0x19] = 0; nodes[0x19] < stack0xffffffffffffffd8->max;
          nodes[0x19] = nodes[0x19] + 1) {
        RVar1 = ref_cell_nodes(stack0xffffffffffffffd8,nodes[0x19],(REF_INT *)&quality);
        if ((RVar1 == 0) && (max_id == nodes[(long)stack0xffffffffffffffd8->node_per + -2])) {
          for (n1 = 0; n1 < 3; n1 = n1 + 1) {
            id = n1;
            min_id = n1 + 1;
            if (2 < min_id) {
              min_id = n1 + -2;
            }
            uVar2 = ref_node_ratio(ref_grid->node,nodes[(long)n1 + -2],nodes[(long)min_id + -2],
                                   &min_ratio);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                     ,0x241,"ref_adapt_tattle_faces",(ulong)uVar2,"rat");
              return uVar2;
            }
            if (min_ratio <= max_ratio) {
              local_150 = min_ratio;
            }
            else {
              local_150 = max_ratio;
            }
            max_ratio = local_150;
            if (angle <= min_ratio) {
              local_158 = min_ratio;
            }
            else {
              local_158 = angle;
            }
            angle = local_158;
          }
          if (min_quality <= normdev) {
            local_160 = min_quality;
          }
          else {
            local_160 = normdev;
          }
          normdev = local_160;
        }
      }
      min_ratio = max_ratio;
      uVar2 = ref_mpi_min(ref_mpi_00,&min_ratio,&max_ratio,3);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",
               0x248,"ref_adapt_tattle_faces",(ulong)uVar2,"mpi min");
        return uVar2;
      }
      uVar2 = ref_mpi_bcast(ref_mpi_00,&max_ratio,1,3);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",
               0x249,"ref_adapt_tattle_faces",(ulong)uVar2,"min");
        return uVar2;
      }
      min_ratio = angle;
      uVar2 = ref_mpi_max(ref_mpi_00,&min_ratio,&angle,3);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",
               0x24b,"ref_adapt_tattle_faces",(ulong)uVar2,"mpi max");
        return uVar2;
      }
      uVar2 = ref_mpi_bcast(ref_mpi_00,&angle,1,3);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",
               0x24c,"ref_adapt_tattle_faces",(ulong)uVar2,"max");
        return uVar2;
      }
      if ((ref_mpi_00->id == 0) &&
         ((((normdev < 0.1 || (max_ratio < 0.1)) || (4.0 < angle)) || (ratio < 0.5)))) {
        printf("face%6d quality %6.4f ratio %6.4f %6.2f normdev %6.4f topo angle %5.2f\n",normdev,
               max_ratio,angle,ratio,min_angle,(ulong)(uint)max_id);
      }
    }
    ref_grid_local._4_4_ = 0;
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",0x216,
           "ref_adapt_tattle_faces",(ulong)ref_grid_local._4_4_,"id range");
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_adapt_tattle_faces(REF_GRID ref_grid) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_CELL ref_cell;
  REF_INT cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL quality, min_quality;
  REF_DBL normdev, min_normdev;
  REF_DBL ratio, min_ratio, max_ratio;
  REF_DBL angle, min_angle;
  REF_INT edge, n0, n1;
  REF_INT id, min_id, max_id;

  ref_cell = ref_grid_tri(ref_grid);
  RSS(ref_cell_id_range(ref_cell, ref_mpi, &min_id, &max_id), "id range");
  for (id = min_id; id <= max_id; id++) {
    min_quality = 1.0;
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      if (id != nodes[ref_cell_id_index(ref_cell)]) continue;
      RSS(ref_node_tri_quality(ref_grid_node(ref_grid), nodes, &quality),
          "qual");
      min_quality = MIN(min_quality, quality);
    }
    quality = min_quality;
    RSS(ref_mpi_min(ref_mpi, &quality, &min_quality, REF_DBL_TYPE), "min");
    RSS(ref_mpi_bcast(ref_mpi, &quality, 1, REF_DBL_TYPE), "min");

    min_normdev = 2.0;
    min_angle = 90.0;
    if (ref_geom_model_loaded(ref_grid_geom(ref_grid)) ||
        ref_geom_meshlinked(ref_grid_geom(ref_grid))) {
      ref_cell = ref_grid_tri(ref_grid);
      each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
        if (id != nodes[ref_cell_id_index(ref_cell)]) continue;
        RSS(ref_geom_tri_norm_deviation(ref_grid, nodes, &normdev), "norm dev");
        min_normdev = MIN(min_normdev, normdev);
        RSS(ref_adapt_min_sliver_angle(ref_grid, nodes, &min_angle),
            "sliver angle");
      }
    }
    normdev = min_normdev;
    RSS(ref_mpi_min(ref_mpi, &normdev, &min_normdev, REF_DBL_TYPE), "mpi max");
    RSS(ref_mpi_bcast(ref_mpi, &min_normdev, 1, REF_DBL_TYPE), "min");
    angle = min_angle;
    RSS(ref_mpi_min(ref_mpi, &angle, &min_angle, REF_DBL_TYPE), "mpi max");
    RSS(ref_mpi_bcast(ref_mpi, &min_angle, 1, REF_DBL_TYPE), "min");

    min_ratio = REF_DBL_MAX;
    max_ratio = REF_DBL_MIN;
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      if (id != nodes[ref_cell_id_index(ref_cell)]) continue;
      for (edge = 0; edge < 3; edge++) {
        n0 = edge;
        n1 = edge + 1;
        if (n1 > 2) n1 -= 3;
        RSS(ref_node_ratio(ref_grid_node(ref_grid), nodes[n0], nodes[n1],
                           &ratio),
            "rat");
        min_ratio = MIN(min_ratio, ratio);
        max_ratio = MAX(max_ratio, ratio);
      }
      min_quality = MIN(min_quality, quality);
    }
    ratio = min_ratio;
    RSS(ref_mpi_min(ref_mpi, &ratio, &min_ratio, REF_DBL_TYPE), "mpi min");
    RSS(ref_mpi_bcast(ref_mpi, &min_ratio, 1, REF_DBL_TYPE), "min");
    ratio = max_ratio;
    RSS(ref_mpi_max(ref_mpi, &ratio, &max_ratio, REF_DBL_TYPE), "mpi max");
    RSS(ref_mpi_bcast(ref_mpi, &max_ratio, 1, REF_DBL_TYPE), "max");

    if (ref_mpi_once(ref_mpi)) {
      if (min_quality < 0.1 || min_ratio < 0.1 || max_ratio > 4.0 ||
          min_normdev < 0.5) {
        printf(
            "face%6d quality %6.4f ratio %6.4f %6.2f normdev %6.4f"
            " topo angle %5.2f\n",
            id, min_quality, min_ratio, max_ratio, min_normdev, angle);
      }
    }
  }

  return REF_SUCCESS;
}